

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  uint uVar1;
  uint uVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  int iVar17;
  U32 *pUVar18;
  uint *puVar19;
  BYTE *pBVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  U32 *pUVar24;
  uint *puVar25;
  uint uVar26;
  int iVar27;
  BYTE *pBVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  byte *pInLimit;
  U32 UVar40;
  BYTE *pBVar41;
  U32 *local_100;
  ulong local_f8;
  int local_ec;
  ulong local_a0;
  U32 dummy32;
  U32 local_5c;
  ulong local_58;
  uint *local_50;
  byte *local_48;
  BYTE *local_40;
  byte *local_38;
  
  local_58 = (ulong)(mls - 5);
  cVar15 = (char)(ms->cParams).hashLog;
  switch(local_58) {
  case 0:
    lVar23 = -0x30e4432345000000;
    break;
  case 1:
    lVar23 = -0x30e4432340650000;
    break;
  case 2:
    lVar23 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar37 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_001e1d39;
  default:
    uVar37 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar15 & 0x1fU));
    goto LAB_001e1d3e;
  }
  uVar37 = lVar23 * *(long *)ip;
LAB_001e1d39:
  uVar37 = uVar37 >> (-cVar15 & 0x3fU);
LAB_001e1d3e:
  pBVar3 = (ms->window).base;
  uVar35 = (int)ip - (int)pBVar3;
  uVar29 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar16 = (ms->window).lowLimit;
  uVar26 = uVar35 - uVar29;
  if (uVar35 - uVar16 <= uVar29) {
    uVar26 = uVar16;
  }
  if (ms->loadedDictEnd != 0) {
    uVar26 = uVar16;
  }
  uVar29 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar16 = uVar35 - uVar29;
  if (uVar35 < uVar29) {
    uVar16 = 0;
  }
  uVar30 = uVar26;
  if (uVar26 < uVar16) {
    uVar30 = uVar16;
  }
  uVar38 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  local_50 = ms->hashTable + uVar37;
  pUVar4 = ms->chainTable;
  puVar10 = local_50;
  uVar22 = 0;
  uVar39 = uVar38;
  while (uVar1 = *puVar10, uVar30 < uVar1) {
    puVar10 = pUVar4 + (uVar1 & uVar29) * 2;
    if ((puVar10[1] != 1) || (uVar39 < 2)) {
      if (puVar10[1] == 1) {
        puVar10[0] = 0;
        puVar10[1] = 0;
      }
      break;
    }
    puVar10[1] = uVar22;
    uVar39 = uVar39 - 1;
    uVar22 = uVar1;
  }
  do {
    if (uVar22 == 0) break;
    uVar1 = pUVar4[(ulong)((uVar22 & uVar29) * 2) + 1];
    pBVar5 = (ms->window).dictBase;
    uVar2 = (ms->window).dictLimit;
    uVar37 = (ulong)uVar2;
    local_38 = pBVar5 + uVar37;
    pInLimit = iend;
    pBVar41 = pBVar3;
    if (uVar22 < uVar2) {
      pInLimit = local_38;
      pBVar41 = pBVar5;
    }
    uVar34 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    local_40 = pBVar3 + uVar37;
    uVar8 = (uVar22 & uVar34) * 2;
    local_100 = pUVar4 + uVar8;
    uVar9 = (ms->window).lowLimit;
    uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar33 = uVar22 - uVar21;
    if (uVar22 - uVar9 <= uVar21) {
      uVar33 = uVar9;
    }
    UVar40 = pUVar4[uVar8];
    uVar9 = 0;
    uVar32 = 0;
    pUVar24 = pUVar4 + uVar8 + 1;
    uVar13 = 0;
    local_48 = pInLimit;
LAB_001e1efd:
    if ((uVar39 == uVar9) || (UVar40 <= uVar33)) goto LAB_001e2071;
    uVar12 = uVar13;
    if (uVar32 < uVar13) {
      uVar12 = uVar32;
    }
    uVar14 = (ulong)UVar40;
    pBVar28 = pBVar3;
    if (dictMode == ZSTD_extDict) {
      if ((uVar22 < uVar2) || (uVar37 <= uVar12 + uVar14)) {
        if (uVar12 + uVar14 < uVar37) {
          pBVar28 = pBVar5;
        }
        goto LAB_001e1fae;
      }
      sVar11 = ZSTD_count_2segments
                         (pBVar41 + uVar12 + uVar22,pBVar5 + uVar14 + uVar12,pInLimit,local_38,
                          local_40);
      uVar12 = sVar11 + uVar12;
      pBVar28 = pBVar3 + uVar14;
      pInLimit = local_48;
      if (uVar12 + uVar14 < uVar37) {
        pBVar28 = pBVar5 + uVar14;
      }
    }
    else {
LAB_001e1fae:
      sVar11 = ZSTD_count(pBVar41 + uVar12 + uVar22,pBVar28 + uVar14 + uVar12,pInLimit);
      uVar12 = sVar11 + uVar12;
      pBVar28 = pBVar28 + uVar14;
    }
    if (pBVar41 + uVar12 + uVar22 == pInLimit) goto LAB_001e2071;
    pUVar18 = pUVar4 + (UVar40 & uVar34) * 2;
    if (pBVar41[uVar12 + uVar22] <= pBVar28[uVar12]) {
      *pUVar24 = UVar40;
      pUVar24 = pUVar18;
      if (UVar40 <= uVar30) {
        pUVar24 = &local_5c;
        goto LAB_001e2071;
      }
LAB_001e2037:
      UVar40 = *pUVar24;
      uVar9 = uVar9 + 1;
      pUVar24 = pUVar18;
      uVar13 = uVar12;
      goto LAB_001e1efd;
    }
    *local_100 = UVar40;
    if (uVar30 < UVar40) {
      local_100 = pUVar18 + 1;
      pUVar18 = pUVar24;
      pUVar24 = local_100;
      uVar32 = uVar12;
      uVar12 = uVar13;
      goto LAB_001e2037;
    }
    local_100 = &local_5c;
LAB_001e2071:
    *pUVar24 = 0;
    *local_100 = 0;
    uVar39 = uVar39 + 1;
    uVar22 = uVar1;
  } while( true );
  pBVar5 = (ms->window).dictBase;
  uVar12 = (ulong)(ms->window).dictLimit;
  uVar13 = (ulong)((uVar29 & uVar35) * 2);
  puVar10 = pUVar4 + uVar13;
  local_ec = uVar35 + 9;
  uVar30 = *local_50;
  *local_50 = uVar35;
  iVar27 = -uVar38;
  uVar32 = 0;
  uVar37 = 0;
  local_f8 = 0;
  puVar25 = pUVar4 + uVar13 + 1;
  do {
    iVar27 = iVar27 + 1;
    uVar13 = (ulong)uVar30;
    if ((iVar27 == 1) || (uVar30 <= uVar26)) goto LAB_001e22d8;
    uVar14 = uVar37;
    if (uVar32 < uVar37) {
      uVar14 = uVar32;
    }
    if ((dictMode == ZSTD_extDict) && (uVar13 + uVar14 < uVar12)) {
      pBVar28 = pBVar5 + uVar13;
      sVar11 = ZSTD_count_2segments
                         (ip + uVar14,pBVar28 + uVar14,iend,pBVar5 + uVar12,pBVar3 + uVar12);
      uVar14 = sVar11 + uVar14;
      pBVar41 = pBVar3 + uVar13;
      if (uVar14 + uVar13 < uVar12) {
        pBVar41 = pBVar28;
      }
    }
    else {
      sVar11 = ZSTD_count(ip + uVar14,pBVar3 + uVar13 + uVar14,iend);
      uVar14 = sVar11 + uVar14;
      pBVar41 = pBVar3 + uVar13;
    }
    if (local_f8 < uVar14) {
      if (local_ec - uVar30 < uVar14) {
        local_ec = uVar30 + (int)uVar14;
      }
      iVar17 = (int)uVar14 - (int)local_f8;
      uVar22 = (uVar35 + 1) - uVar30;
      iVar36 = 0x1f;
      if (uVar22 != 0) {
        for (; uVar22 >> iVar36 == 0; iVar36 = iVar36 + -1) {
        }
      }
      uVar22 = (int)*offsetPtr + 1;
      iVar31 = 0x1f;
      if (uVar22 != 0) {
        for (; uVar22 >> iVar31 == 0; iVar31 = iVar31 + -1) {
        }
      }
      if (iVar36 - iVar31 < iVar17 * 4) {
        *offsetPtr = (ulong)((uVar35 + 2) - uVar30);
        local_f8 = uVar14;
      }
      if (ip + uVar14 == iend) {
        iVar27 = -iVar27;
        if (dictMode == ZSTD_dictMatchState) {
          iVar27 = 0;
        }
        goto LAB_001e22da;
      }
    }
    puVar19 = pUVar4 + (uVar30 & uVar29) * 2;
    if (pBVar41[uVar14] < ip[uVar14]) {
      *puVar10 = uVar30;
      if (uVar30 <= uVar16) {
        puVar10 = &dummy32;
LAB_001e22d8:
        iVar27 = -iVar27;
LAB_001e22da:
        uVar37 = local_58;
        *puVar25 = 0;
        *puVar10 = 0;
        if ((dictMode == ZSTD_dictMatchState) && (iVar27 != 0)) {
          pZVar6 = ms->dictMatchState;
          if ((uint)uVar37 < 4) {
            sVar11 = (*(code *)(&DAT_0024843c + *(int *)(&DAT_0024843c + uVar37 * 4)))
                               (&DAT_0024843c + *(int *)(&DAT_0024843c + uVar37 * 4));
            return sVar11;
          }
          puVar10 = pZVar6->hashTable +
                    ((uint)(*(int *)ip * -0x61c8864f) >> (-(char)(pZVar6->cParams).hashLog & 0x1fU))
          ;
          uVar16 = (ms->window).dictLimit;
          pBVar5 = (pZVar6->window).nextSrc;
          pBVar41 = (pZVar6->window).base;
          uVar37 = (long)pBVar5 - (long)pBVar41;
          uVar26 = (pZVar6->window).lowLimit;
          iVar36 = (int)uVar37;
          uVar22 = (ms->window).lowLimit - iVar36;
          uVar30 = ~(-1 << ((char)(pZVar6->cParams).chainLog - 1U & 0x1f));
          uVar29 = iVar36 - uVar30;
          if (iVar36 - uVar26 <= uVar30) {
            uVar29 = uVar26;
          }
          pUVar4 = pZVar6->chainTable;
          local_a0 = 0;
          uVar32 = 0;
          while( true ) {
            iVar27 = -iVar27;
            while( true ) {
              iVar27 = iVar27 + 1;
              if (iVar27 == 1) goto LAB_001e2548;
              uVar39 = *puVar10;
              uVar13 = (ulong)uVar39;
              if (uVar39 <= uVar26) goto LAB_001e2548;
              uVar12 = uVar32;
              if (local_a0 < uVar32) {
                uVar12 = local_a0;
              }
              pBVar28 = pBVar41 + uVar13;
              sVar11 = ZSTD_count_2segments
                                 (ip + uVar12,pBVar28 + uVar12,iend,pBVar5,pBVar3 + uVar16);
              uVar12 = sVar11 + uVar12;
              pBVar20 = pBVar3 + uVar13 + uVar22;
              if (uVar12 + uVar13 < (uVar37 & 0xffffffff)) {
                pBVar20 = pBVar28;
              }
              if (local_f8 < uVar12) {
                iVar17 = uVar22 + uVar39;
                iVar31 = (int)uVar12 - (int)local_f8;
                uVar38 = (uVar35 + 1) - iVar17;
                iVar36 = 0x1f;
                if (uVar38 != 0) {
                  for (; uVar38 >> iVar36 == 0; iVar36 = iVar36 + -1) {
                  }
                }
                uVar38 = (int)*offsetPtr + 1;
                iVar7 = 0x1f;
                if (uVar38 != 0) {
                  for (; uVar38 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                  }
                }
                if (iVar36 - iVar7 < iVar31 * 4) {
                  *offsetPtr = (ulong)((uVar35 + 2) - iVar17);
                  local_f8 = uVar12;
                }
                if (ip + uVar12 == iend) goto LAB_001e2548;
              }
              puVar10 = pUVar4 + (uVar39 & uVar30) * 2;
              if (pBVar20[uVar12] < ip[uVar12]) break;
              uVar32 = uVar12;
              if (uVar39 <= uVar29) goto LAB_001e2548;
            }
            if (uVar39 <= uVar29) break;
            iVar27 = -iVar27;
            puVar10 = puVar10 + 1;
            local_a0 = uVar12;
          }
        }
LAB_001e2548:
        ms->nextToUpdate = local_ec - 8;
        return local_f8;
      }
      puVar10 = puVar19 + 1;
      puVar19 = puVar25;
      puVar25 = puVar10;
      uVar32 = uVar14;
    }
    else {
      *puVar25 = uVar30;
      uVar37 = uVar14;
      puVar25 = puVar19;
      if (uVar30 <= uVar16) {
        puVar25 = &dummy32;
        goto LAB_001e22d8;
      }
    }
    uVar30 = *puVar25;
    puVar25 = puVar19;
  } while( true );
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + curr - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}